

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

TestObject * __thiscall StressTester::CreateLinkedList(StressTester *this)

{
  Recycler *pRVar1;
  int iVar2;
  size_t sVar3;
  TestObject *pTVar4;
  TestObject *val;
  TestObject *next;
  int local_28;
  CreateOptions options;
  int i;
  int length;
  TestObject *curr;
  TestObject *root;
  StressTester *this_local;
  
  pRVar1 = this->recycler;
  sVar3 = GetRandomSize(this);
  pTVar4 = TestObject::Create(pRVar1,1,sVar3,NormalObj);
  iVar2 = PAL_rand();
  _i = pTVar4;
  for (local_28 = 0; local_28 < iVar2 % 100; local_28 = local_28 + 1) {
    pRVar1 = this->recycler;
    sVar3 = GetRandomSize(this);
    val = TestObject::Create(pRVar1,(uint)(local_28 != iVar2 % 100 + -1),sVar3,NormalObj);
    TestObject::Add(_i,val);
    _i = val;
  }
  return pTVar4;
}

Assistant:

TestObject* StressTester::CreateLinkedList()
{
    TestObject *root = TestObject::Create(recycler, 1, GetRandomSize());
    TestObject *curr = root;
    int length = rand() % MaxLinkedListLength;
    for (int i = 0; i < length; ++i)
    {
        CreateOptions options = (i == length - 1) ? LeafObj : NormalObj;
        TestObject *next = TestObject::Create(recycler, options == LeafObj ? 0 : 1, GetRandomSize());
        curr->Add(next);
        curr = next;
    }
    return root;
}